

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft_reaper.cc
# Opt level: O2

float __thiscall
sptk::reaper::FFT::get_band_rms(FFT *this,float *x,float *y,int first_bin,int last_bin)

{
  long lVar1;
  int i;
  double dVar2;
  
  dVar2 = 0.0;
  for (lVar1 = (long)first_bin; lVar1 <= last_bin; lVar1 = lVar1 + 1) {
    dVar2 = dVar2 + (double)(x[lVar1] * x[lVar1] + y[lVar1] * y[lVar1]);
  }
  dVar2 = dVar2 / (double)((last_bin - first_bin) + 1);
  if (dVar2 < 0.0) {
    dVar2 = sqrt(dVar2);
  }
  else {
    dVar2 = SQRT(dVar2);
  }
  return (float)dVar2;
}

Assistant:

float FFT::get_band_rms(float *x, float*y, int first_bin, int last_bin) {
  double sum = 0.0;
  for (int i = first_bin; i <= last_bin; ++i) {
    sum += (x[i] * x[i]) + (y[i] * y[i]);
  }
  return sqrt(sum / (last_bin - first_bin + 1));
}